

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O0

UChar * u_strFindFirst_63(UChar *s,int32_t length,UChar *sub,int32_t subLength)

{
  UChar UVar1;
  UBool UVar2;
  int iVar3;
  UChar *pUVar4;
  UChar *pUVar5;
  UChar *local_70;
  UChar *preLimit;
  UChar *limit;
  UChar cq;
  UChar cs;
  UChar c;
  UChar *subLimit;
  UChar *q;
  UChar *p;
  UChar *start;
  int32_t subLength_local;
  UChar *sub_local;
  UChar *pUStack_18;
  int32_t length_local;
  UChar *s_local;
  
  s_local = s;
  if ((sub != (UChar *)0x0) && (-2 < subLength)) {
    if ((s == (UChar *)0x0) || (length < -1)) {
      s_local = (UChar *)0x0;
    }
    else if ((length < 0) && (subLength < 0)) {
      UVar1 = *sub;
      if (UVar1 != L'\0') {
        pUVar4 = s;
        if ((sub[1] == L'\0') && (pUVar4 = s, (UVar1 & 0xf800U) != 0xd800)) {
          s_local = u_strchr_63(s,UVar1);
        }
        else {
LAB_0049dce5:
          do {
            do {
              pUStack_18 = pUVar4;
              pUVar4 = pUStack_18 + 1;
              if (*pUStack_18 == L'\0') {
                return (UChar *)0x0;
              }
              subLimit = sub + 1;
              q = pUVar4;
            } while (*pUStack_18 != UVar1);
            for (; *subLimit != L'\0'; subLimit = subLimit + 1) {
              if (*q == L'\0') {
                return (UChar *)0x0;
              }
              if (*q != *subLimit) goto LAB_0049dce5;
              q = q + 1;
            }
            UVar2 = isMatchAtCPBoundary(s,pUStack_18,q,(UChar *)0x0);
          } while (UVar2 == '\0');
          s_local = pUStack_18;
        }
      }
    }
    else {
      start._4_4_ = subLength;
      if (subLength < 0) {
        start._4_4_ = u_strlen_63(sub);
      }
      if (start._4_4_ != 0) {
        pUVar4 = sub + 1;
        UVar1 = *sub;
        iVar3 = start._4_4_ + -1;
        if ((iVar3 == 0) && ((UVar1 & 0xf800U) != 0xd800)) {
          if (length < 0) {
            local_70 = u_strchr_63(s,UVar1);
          }
          else {
            local_70 = u_memchr_63(s,UVar1,length);
          }
          s_local = local_70;
        }
        else {
          pUVar5 = s;
          if (length < 0) {
LAB_0049de7e:
            do {
              do {
                pUStack_18 = pUVar5;
                pUVar5 = pUStack_18 + 1;
                if (*pUStack_18 == L'\0') {
                  return (UChar *)0x0;
                }
                subLimit = pUVar4;
                q = pUVar5;
              } while (*pUStack_18 != UVar1);
              for (; subLimit != pUVar4 + iVar3; subLimit = subLimit + 1) {
                if (*q == L'\0') {
                  return (UChar *)0x0;
                }
                if (*q != *subLimit) goto LAB_0049de7e;
                q = q + 1;
              }
              UVar2 = isMatchAtCPBoundary(s,pUStack_18,q,(UChar *)0x0);
            } while (UVar2 == '\0');
            s_local = pUStack_18;
          }
          else if (iVar3 < length) {
            pUVar5 = s;
LAB_0049df92:
            do {
              do {
                pUStack_18 = pUVar5;
                if (pUStack_18 == s + length + -(long)iVar3) {
                  return (UChar *)0x0;
                }
                pUVar5 = pUStack_18 + 1;
                subLimit = pUVar4;
                q = pUVar5;
              } while (*pUStack_18 != UVar1);
              for (; subLimit != pUVar4 + iVar3; subLimit = subLimit + 1) {
                if (*q != *subLimit) goto LAB_0049df92;
                q = q + 1;
              }
              UVar2 = isMatchAtCPBoundary(s,pUStack_18,q,s + length);
            } while (UVar2 == '\0');
            s_local = pUStack_18;
          }
          else {
            s_local = (UChar *)0x0;
          }
        }
      }
    }
  }
  return s_local;
}

Assistant:

U_CAPI UChar * U_EXPORT2
u_strFindFirst(const UChar *s, int32_t length,
               const UChar *sub, int32_t subLength) {
    const UChar *start, *p, *q, *subLimit;
    UChar c, cs, cq;

    if(sub==NULL || subLength<-1) {
        return (UChar *)s;
    }
    if(s==NULL || length<-1) {
        return NULL;
    }

    start=s;

    if(length<0 && subLength<0) {
        /* both strings are NUL-terminated */
        if((cs=*sub++)==0) {
            return (UChar *)s;
        }
        if(*sub==0 && !U16_IS_SURROGATE(cs)) {
            /* the substring consists of a single, non-surrogate BMP code point */
            return u_strchr(s, cs);
        }

        while((c=*s++)!=0) {
            if(c==cs) {
                /* found first substring UChar, compare rest */
                p=s;
                q=sub;
                for(;;) {
                    if((cq=*q)==0) {
                        if(isMatchAtCPBoundary(start, s-1, p, NULL)) {
                            return (UChar *)(s-1); /* well-formed match */
                        } else {
                            break; /* no match because surrogate pair is split */
                        }
                    }
                    if((c=*p)==0) {
                        return NULL; /* no match, and none possible after s */
                    }
                    if(c!=cq) {
                        break; /* no match */
                    }
                    ++p;
                    ++q;
                }
            }
        }

        /* not found */
        return NULL;
    }

    if(subLength<0) {
        subLength=u_strlen(sub);
    }
    if(subLength==0) {
        return (UChar *)s;
    }

    /* get sub[0] to search for it fast */
    cs=*sub++;
    --subLength;
    subLimit=sub+subLength;

    if(subLength==0 && !U16_IS_SURROGATE(cs)) {
        /* the substring consists of a single, non-surrogate BMP code point */
        return length<0 ? u_strchr(s, cs) : u_memchr(s, cs, length);
    }

    if(length<0) {
        /* s is NUL-terminated */
        while((c=*s++)!=0) {
            if(c==cs) {
                /* found first substring UChar, compare rest */
                p=s;
                q=sub;
                for(;;) {
                    if(q==subLimit) {
                        if(isMatchAtCPBoundary(start, s-1, p, NULL)) {
                            return (UChar *)(s-1); /* well-formed match */
                        } else {
                            break; /* no match because surrogate pair is split */
                        }
                    }
                    if((c=*p)==0) {
                        return NULL; /* no match, and none possible after s */
                    }
                    if(c!=*q) {
                        break; /* no match */
                    }
                    ++p;
                    ++q;
                }
            }
        }
    } else {
        const UChar *limit, *preLimit;

        /* subLength was decremented above */
        if(length<=subLength) {
            return NULL; /* s is shorter than sub */
        }

        limit=s+length;

        /* the substring must start before preLimit */
        preLimit=limit-subLength;

        while(s!=preLimit) {
            c=*s++;
            if(c==cs) {
                /* found first substring UChar, compare rest */
                p=s;
                q=sub;
                for(;;) {
                    if(q==subLimit) {
                        if(isMatchAtCPBoundary(start, s-1, p, limit)) {
                            return (UChar *)(s-1); /* well-formed match */
                        } else {
                            break; /* no match because surrogate pair is split */
                        }
                    }
                    if(*p!=*q) {
                        break; /* no match */
                    }
                    ++p;
                    ++q;
                }
            }
        }
    }

    /* not found */
    return NULL;
}